

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_free_options(nn_commandline *cline,void *target)

{
  nn_option_type nVar1;
  nn_option *pnVar2;
  long *plVar3;
  nn_string_list *lst;
  nn_blob *blob;
  nn_option *opt;
  int j;
  int i;
  void *target_local;
  nn_commandline *cline_local;
  
  opt._4_4_ = 0;
  do {
    pnVar2 = cline->options + opt._4_4_;
    if (pnVar2->longname == (char *)0x0) {
      return;
    }
    nVar1 = pnVar2->type;
    if (nVar1 == NN_OPT_BLOB) {
LAB_00104aab:
      plVar3 = (long *)((long)target + (long)pnVar2->offset);
      if (((int)plVar3[2] != 0) && (*plVar3 != 0)) {
        free((void *)*plVar3);
        *(undefined4 *)(plVar3 + 2) = 0;
      }
    }
    else if (nVar1 - NN_OPT_LIST_APPEND < 2) {
      plVar3 = (long *)((long)target + (long)pnVar2->offset);
      if (plVar3 == (long *)0x0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","lst",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tools/options.c"
                ,0x31e);
        fflush(_stderr);
        nn_err_abort();
      }
      if (*plVar3 != 0) {
        free((void *)*plVar3);
        *plVar3 = 0;
      }
      if (plVar3[1] != 0) {
        for (opt._0_4_ = 0; (int)opt < *(int *)((long)plVar3 + 0x14); opt._0_4_ = (int)opt + 1) {
          free(*(void **)(plVar3[1] + (long)(int)opt * 8));
        }
        free((void *)plVar3[1]);
        plVar3[1] = 0;
      }
    }
    else if (nVar1 == NN_OPT_READ_FILE) goto LAB_00104aab;
    opt._4_4_ = opt._4_4_ + 1;
  } while( true );
}

Assistant:

void nn_free_options (struct nn_commandline *cline, void *target) {
    int i, j;
    struct nn_option *opt;
    struct nn_blob *blob;
    struct nn_string_list *lst;

    for (i = 0;; ++i) {
        opt = &cline->options[i];
        if (!opt->longname)
            break;
        switch(opt->type) {
        case NN_OPT_LIST_APPEND:
        case NN_OPT_LIST_APPEND_FMT:
            lst = (struct nn_string_list *)(((char *)target) + opt->offset);
            nn_assert (lst);
            if(lst->items) {
                free(lst->items);
                lst->items = NULL;
            }
            if(lst->to_free) {
                for(j = 0; j < lst->to_free_num; ++j) {
                    free(lst->to_free[j]);
                }
                free(lst->to_free);
                lst->to_free = NULL;
            }
            break;
        case NN_OPT_READ_FILE:
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)target) + opt->offset);
            if(blob->need_free && blob->data) {
                free(blob->data);
                blob->need_free = 0;
            }
            break;
        default:
            break;
        }
    }
}